

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  bool bVar1;
  cmTarget *this_00;
  cmSourceFile *this_01;
  string tLocation;
  string depLocation;
  string name;
  string local_b8;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  cmsys::SystemTools::GetFilenameName(&local_70,inName);
  bVar1 = std::operator==(&local_70,"");
  if (bVar1) {
LAB_0033fe1d:
    bVar1 = false;
  }
  else {
    cmsys::SystemTools::GetFilenameLastExtension(&local_b8,&local_70);
    bVar1 = std::operator==(&local_b8,".exe");
    std::__cxx11::string::~string((string *)&local_b8);
    if (bVar1) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b8,&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    this_00 = cmMakefile::FindTargetToUse(this->Makefile,&local_70,false);
    if (this_00 != (cmTarget *)0x0) {
      bVar1 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
      if (bVar1) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        if (this_00->TargetTypeValue < OBJECT_LIBRARY) {
          cmTarget::GetLocation(this_00,config);
          std::__cxx11::string::assign((char *)&local_b8);
          cmsys::SystemTools::GetFilenamePath(&local_90,&local_b8);
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          cmsys::SystemTools::CollapseFullPath(&local_90,&local_b8);
          std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        std::__cxx11::string::string((string *)&local_50,(string *)inName);
        cmsys::SystemTools::GetFilenamePath(&local_90,&local_50);
        local_98 = dep;
        std::__cxx11::string::~string((string *)&local_50);
        cmsys::SystemTools::CollapseFullPath(&local_50,&local_90);
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        bVar1 = std::operator!=(&local_90,&local_b8);
        if (bVar1) {
          std::__cxx11::string::_M_assign((string *)local_98);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b8);
          bVar1 = true;
          goto LAB_0033fe1f;
        }
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b8);
        dep = local_98;
      }
      if (this_00->TargetTypeValue < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
        if ((0x10fU >> (this_00->TargetTypeValue & 0x1f) & 1) != 0) {
          cmTarget::GetLocation(this_00,config);
          bVar1 = true;
          std::__cxx11::string::assign((char *)dep);
          goto LAB_0033fe1f;
        }
        goto LAB_0033fe1d;
      }
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath((inName->_M_dataplus)._M_p);
    if (bVar1) {
      bVar1 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName);
      if (this_01 == (cmSourceFile *)0x0) {
        cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
        std::__cxx11::string::assign((char *)dep);
        std::__cxx11::string::append((char *)dep);
        bVar1 = true;
        std::__cxx11::string::append((string *)dep);
      }
      else {
        cmSourceFile::GetFullPath(this_01,(string *)0x0);
        bVar1 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_0033fe1f:
  std::__cxx11::string::~string((string *)&local_70);
  return bVar1;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if(name == "")
    {
    return false;
    }

  if(cmSystemTools::GetFilenameLastExtension(name) == ".exe")
    {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
    }

  // Look for a CMake target with the given name.
  if(cmTarget* target = this->Makefile->FindTargetToUse(name))
    {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if(cmSystemTools::FileIsFullPath(inName.c_str()))
      {
      std::string tLocation;
      if(target->GetType() >= cmTarget::EXECUTABLE &&
         target->GetType() <= cmTarget::MODULE_LIBRARY)
        {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
        }
      std::string depLocation = cmSystemTools::GetFilenamePath(
        std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if(depLocation != tLocation)
        {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
        }
      }
    switch (target->GetType())
      {
      case cmTarget::EXECUTABLE:
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmTarget::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmTarget::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmTarget::UTILITY:
      case cmTarget::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
      }
    }

  // The name was not that of a CMake target.  It must name a file.
  if(cmSystemTools::FileIsFullPath(inName.c_str()))
    {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
    }

  // Check for a source file in this directory that matches the
  // dependency.
  if(cmSourceFile* sf = this->Makefile->GetSource(inName))
    {
    dep = sf->GetFullPath();
    return true;
    }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetCurrentSourceDirectory();
  dep += "/";
  dep += inName;
  return true;
}